

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thrift_tools.hpp
# Opt level: O2

void __thiscall
duckdb::ReadAheadBuffer::AddReadHead
          (ReadAheadBuffer *this,idx_t pos,uint64_t len,bool merge_buffers)

{
  ulong *puVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  long lVar4;
  _List_node_base *p_Var5;
  iterator iVar6;
  idx_t iVar7;
  runtime_error *this_00;
  undefined7 in_register_00000009;
  ulong uVar8;
  ReadHead new_read_head;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((int)CONCAT71(in_register_00000009,merge_buffers) != 0) {
    ReadHead::ReadHead(&new_read_head,pos,len);
    local_170._M_dataplus._M_p = (pointer)&new_read_head;
    iVar6 = ::std::
            _Rb_tree<duckdb::ReadHead_*,_duckdb::ReadHead_*,_std::_Identity<duckdb::ReadHead_*>,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
            ::find(&(this->merge_set)._M_t,(key_type *)&local_170);
    if ((_Rb_tree_header *)iVar6._M_node != &(this->merge_set)._M_t._M_impl.super__Rb_tree_header) {
      puVar1 = *(ulong **)(iVar6._M_node + 1);
      uVar2 = *puVar1;
      iVar7 = new_read_head.location;
      if (uVar2 < new_read_head.location) {
        iVar7 = uVar2;
      }
      uVar8 = new_read_head.location + new_read_head.size;
      if (new_read_head.location + new_read_head.size < uVar2 + puVar1[1]) {
        uVar8 = uVar2 + puVar1[1];
      }
      *puVar1 = iVar7;
      puVar1[1] = uVar8 - iVar7;
      BufferHandle::~BufferHandle(&new_read_head.buffer_handle);
      return;
    }
    BufferHandle::~BufferHandle(&new_read_head.buffer_handle);
  }
  ReadHead::ReadHead(&new_read_head,pos,len);
  ::std::__cxx11::list<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>::
  emplace_front<duckdb::ReadHead>(&this->read_heads,&new_read_head);
  BufferHandle::~BufferHandle(&new_read_head.buffer_handle);
  this->total_size = this->total_size + len;
  p_Var3 = (this->read_heads).super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (merge_buffers) {
    new_read_head.location = (idx_t)(p_Var3 + 1);
    ::std::
    _Rb_tree<duckdb::ReadHead*,duckdb::ReadHead*,std::_Identity<duckdb::ReadHead*>,duckdb::ReadHeadComparator,std::allocator<duckdb::ReadHead*>>
    ::_M_insert_unique<duckdb::ReadHead*>
              ((_Rb_tree<duckdb::ReadHead*,duckdb::ReadHead*,std::_Identity<duckdb::ReadHead*>,duckdb::ReadHeadComparator,std::allocator<duckdb::ReadHead*>>
                *)&this->merge_set,(ReadHead **)&new_read_head);
  }
  lVar4 = (long)p_Var3[1]._M_next;
  p_Var5 = *(_List_node_base **)((long)(p_Var3 + 1) + 8);
  iVar7 = CachingFileHandle::GetFileSize(this->file_handle);
  if ((ulong)((long)&p_Var5->_M_next + lVar4) <= iVar7) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  CachingFileHandle::GetPath_abi_cxx11_(&local_f0,this->file_handle);
  ::std::operator+(&local_d0,"Prefetch registered for bytes outside file: ",&local_f0);
  ::std::operator+(&local_b0,&local_d0,", attempted range: [");
  ::std::__cxx11::to_string(&local_110,pos);
  ::std::operator+(&local_90,&local_b0,&local_110);
  ::std::operator+(&local_70,&local_90,", ");
  ::std::__cxx11::to_string
            (&local_130,
             (long)&(*(_List_node_base **)((long)(p_Var3 + 1) + 8))->_M_next +
             (long)p_Var3[1]._M_next);
  ::std::operator+(&local_50,&local_70,&local_130);
  ::std::operator+(&local_170,&local_50,"), file size: ");
  iVar7 = CachingFileHandle::GetFileSize(this->file_handle);
  ::std::__cxx11::to_string(&local_150,iVar7);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &new_read_head,&local_170,&local_150);
  ::std::runtime_error::runtime_error(this_00,(string *)&new_read_head);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void AddReadHead(idx_t pos, uint64_t len, bool merge_buffers = true) {
		// Attempt to merge with existing
		if (merge_buffers) {
			ReadHead new_read_head {pos, len};
			auto lookup_set = merge_set.find(&new_read_head);
			if (lookup_set != merge_set.end()) {
				auto existing_head = *lookup_set;
				auto new_start = MinValue<idx_t>(existing_head->location, new_read_head.location);
				auto new_length = MaxValue<idx_t>(existing_head->GetEnd(), new_read_head.GetEnd()) - new_start;
				existing_head->location = new_start;
				existing_head->size = new_length;
				return;
			}
		}

		read_heads.emplace_front(ReadHead(pos, len));
		total_size += len;
		auto &read_head = read_heads.front();

		if (merge_buffers) {
			merge_set.insert(&read_head);
		}

		if (read_head.GetEnd() > file_handle.GetFileSize()) {
			throw std::runtime_error("Prefetch registered for bytes outside file: " + file_handle.GetPath() +
			                         ", attempted range: [" + std::to_string(pos) + ", " +
			                         std::to_string(read_head.GetEnd()) +
			                         "), file size: " + std::to_string(file_handle.GetFileSize()));
		}
	}